

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Mutex::Block(Mutex *this,PerThreadSynch *s)

{
  bool bVar1;
  State SVar2;
  KernelTimeout KVar3;
  byte local_41;
  char *absl_raw_log_internal_basename;
  int32_t local_24;
  int c;
  PerThreadSynch *s_local;
  Mutex *this_local;
  
  while (SVar2 = std::atomic<absl::lts_20250127::base_internal::PerThreadSynch::State>::load
                           (&s->state,memory_order_acquire), SVar2 == kQueued) {
    bVar1 = DecrementSynchSem(this,s,(KernelTimeout)(s->waitp->timeout).rep_);
    if (!bVar1) {
      TryRemove(this,s);
      local_24 = 0;
      while (s->next != (PerThreadSynch *)0x0) {
        local_24 = synchronization_internal::MutexDelay(local_24,1);
        TryRemove(this,s);
      }
      TryRemove(this,s);
      KVar3 = synchronization_internal::KernelTimeout::Never();
      (s->waitp->timeout).rep_ = KVar3.rep_;
      s->waitp->cond = (Condition *)0x0;
    }
  }
  local_41 = 1;
  if (s->waitp == (SynchWaitParams *)0x0) {
    local_41 = s->suppress_fatal_errors;
  }
  if (((local_41 ^ 0xff) & 1) != 0) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x4b1,"Check %s failed: %s",
               "s->waitp != nullptr || s->suppress_fatal_errors",
               "detected illegal recursion in Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x4b1,"void absl::Mutex::Block(PerThreadSynch *)");
  }
  s->waitp = (SynchWaitParams *)0x0;
  return;
}

Assistant:

void Mutex::Block(PerThreadSynch* s) {
  while (s->state.load(std::memory_order_acquire) == PerThreadSynch::kQueued) {
    if (!DecrementSynchSem(this, s, s->waitp->timeout)) {
      // After a timeout, we go into a spin loop until we remove ourselves
      // from the queue, or someone else removes us.  We can't be sure to be
      // able to remove ourselves in a single lock acquisition because this
      // mutex may be held, and the holder has the right to read the centre
      // of the waiter queue without holding the spinlock.
      this->TryRemove(s);
      int c = 0;
      while (s->next != nullptr) {
        c = synchronization_internal::MutexDelay(c, GENTLE);
        this->TryRemove(s);
      }
      if (kDebugMode) {
        // This ensures that we test the case that TryRemove() is called when s
        // is not on the queue.
        this->TryRemove(s);
      }
      s->waitp->timeout = KernelTimeout::Never();  // timeout is satisfied
      s->waitp->cond = nullptr;  // condition no longer relevant for wakeups
    }
  }
  ABSL_RAW_CHECK(s->waitp != nullptr || s->suppress_fatal_errors,
                 "detected illegal recursion in Mutex code");
  s->waitp = nullptr;
}